

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadNeededValues.hpp
# Opt level: O0

void TasGrid::loadNeededPoints<true,false>
               (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
                *model,TasmanianSparseGrid *grid,size_t num_threads)

{
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  local_40;
  size_t local_20;
  size_t num_threads_local;
  TasmanianSparseGrid *grid_local;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  *model_local;
  
  local_20 = num_threads;
  num_threads_local = (size_t)grid;
  grid_local = (TasmanianSparseGrid *)model;
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  ::function(&local_40,model);
  loadNeededValues<true,false>(&local_40,(TasmanianSparseGrid *)num_threads_local,local_20);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  ::~function(&local_40);
  return;
}

Assistant:

void loadNeededPoints(std::function<void(std::vector<double> const &x, std::vector<double> &y, size_t thread_id)> model,
                      TasmanianSparseGrid &grid, size_t num_threads){
    loadNeededValues<parallel_construction, overwrite_loaded>(model, grid, num_threads);
}